

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftadvanc.c
# Opt level: O1

FT_Error FT_Get_Advances(FT_Face face,FT_UInt start,FT_UInt count,FT_Int32 flags,FT_Fixed *padvances
                        )

{
  uint uVar1;
  FT_Face_GetAdvancesFunc p_Var2;
  FT_Error FVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (face == (FT_Face)0x0) {
    FVar3 = 0x23;
  }
  else if (padvances == (FT_Fixed *)0x0) {
    FVar3 = 6;
  }
  else {
    uVar1 = (uint)face->num_glyphs;
    FVar3 = 0x10;
    if (count + start <= uVar1 && (start < uVar1 && !CARRY4(count,start))) {
      if (count == 0) {
        FVar3 = 0;
      }
      else {
        p_Var2 = face->driver->clazz->get_advances;
        if ((p_Var2 != (FT_Face_GetAdvancesFunc)0x0) &&
           ((flags & 3U) != 0 || (flags & 0xf0000U) == 0x10000)) {
          FVar3 = (*p_Var2)(face,start,count,flags,padvances);
          if (FVar3 == 0) {
            FVar3 = _ft_face_scale_advances(face,padvances,count,flags);
            return FVar3;
          }
          if ((char)FVar3 != '\a') {
            return FVar3;
          }
        }
        FVar3 = 7;
        if (((uint)flags >> 0x1d & 1) == 0) {
          uVar5 = 0;
          uVar4 = 10;
          if ((flags & 1U) != 0) {
            uVar4 = uVar5;
          }
          do {
            FVar3 = FT_Load_Glyph(face,start + (int)uVar5,flags | 0x100);
            if (FVar3 != 0) {
              return FVar3;
            }
            padvances[uVar5] =
                 *(long *)((long)&face->glyph->library + ((ulong)((flags & 0x10U) >> 1) | 0x80)) <<
                 (sbyte)uVar4;
            uVar5 = uVar5 + 1;
            FVar3 = 0;
          } while (count + (count == 0) != uVar5);
        }
      }
    }
  }
  return FVar3;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Get_Advances( FT_Face    face,
                   FT_UInt    start,
                   FT_UInt    count,
                   FT_Int32   flags,
                   FT_Fixed  *padvances )
  {
    FT_Error  error = FT_Err_Ok;

    FT_Face_GetAdvancesFunc  func;

    FT_UInt  num, end, nn;
    FT_Int   factor;


    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    if ( !padvances )
      return FT_THROW( Invalid_Argument );

    num = (FT_UInt)face->num_glyphs;
    end = start + count;
    if ( start >= num || end < start || end > num )
      return FT_THROW( Invalid_Glyph_Index );

    if ( count == 0 )
      return FT_Err_Ok;

    func = face->driver->clazz->get_advances;
    if ( func && LOAD_ADVANCE_FAST_CHECK( face, flags ) )
    {
      error = func( face, start, count, flags, padvances );
      if ( !error )
        return _ft_face_scale_advances( face, padvances, count, flags );

      if ( FT_ERR_NEQ( error, Unimplemented_Feature ) )
        return error;
    }

    error = FT_Err_Ok;

    if ( flags & FT_ADVANCE_FLAG_FAST_ONLY )
      return FT_THROW( Unimplemented_Feature );

    flags |= (FT_UInt32)FT_LOAD_ADVANCE_ONLY;
    factor = ( flags & FT_LOAD_NO_SCALE ) ? 1 : 1024;
    for ( nn = 0; nn < count; nn++ )
    {
      error = FT_Load_Glyph( face, start + nn, flags );
      if ( error )
        break;

      /* scale from 26.6 to 16.16, unless NO_SCALE was requested */
      padvances[nn] = ( flags & FT_LOAD_VERTICAL_LAYOUT )
                      ? face->glyph->advance.y * factor
                      : face->glyph->advance.x * factor;
    }

    return error;
  }